

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::PrepareProgram
          (StorageAndSubImageTest *this,GLchar *variable_declaration,GLchar *tail)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLsizei GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  undefined4 *puVar9;
  ulong uVar10;
  Enum<int,_2UL> EVar11;
  char *local_4a0;
  char *local_490;
  uint local_3ec;
  undefined1 local_3e8 [4];
  GLuint i_2;
  char *local_268;
  GLchar *log_text_1;
  uint local_258;
  GLint log_size_1;
  GLuint i_1;
  GLint status;
  GLchar *local_248;
  GetNameFunc local_240;
  int local_238;
  Enum<int,_2UL> local_230;
  MessageBuilder local_220;
  char *local_a0;
  GLchar *log_text;
  GLint log_size;
  GLint status_1;
  GLuint i;
  undefined4 local_7c;
  undefined *puStack_78;
  GLuint shader_count;
  Shader shader [2];
  Functions *gl;
  GLchar *tail_local;
  GLchar *variable_declaration_local;
  StorageAndSubImageTest *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  shader[1]._32_8_ = CONCAT44(extraout_var,iVar1);
  puStack_78 = s_vertex_shader;
  shader[0].source[0] = (GLchar *)0x0;
  shader[0].source[1] = (GLchar *)0x0;
  shader[0].source[2]._0_4_ = 1;
  shader[0].source[2]._4_4_ = 0x8b31;
  shader[0].count = 0;
  shader[0]._32_8_ = s_fragment_shader_head;
  shader[1].source[2]._0_4_ = 3;
  shader[1].source[2]._4_4_ = 0x8b30;
  shader[1].count = 0;
  local_7c = 2;
  shader[1].source[0] = variable_declaration;
  shader[1].source[1] = tail;
  GVar2 = (**(code **)(shader[1]._32_8_ + 0x3c8))();
  this->m_po = GVar2;
  dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x9c2);
  for (log_size = 0; (uint)log_size < 2; log_size = log_size + 1) {
    GVar4 = (**(code **)(shader[1]._32_8_ + 0x3f0))
                      (*(undefined4 *)((long)shader[(uint)log_size].source + 0x14));
    shader[(uint)log_size].count = GVar4;
    dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
    glu::checkError(dVar3,"glCreateShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9cb);
    (**(code **)(shader[1]._32_8_ + 0x10))(this->m_po,shader[(uint)log_size].count);
    dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
    glu::checkError(dVar3,"glAttachShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9cf);
    uVar10 = (ulong)(uint)log_size;
    (**(code **)(shader[1]._32_8_ + 0x12b8))
              (shader[uVar10].count,*(undefined4 *)(shader[uVar10].source + 2),
               &shader[uVar10 - 1].id,0);
    dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
    glu::checkError(dVar3,"glShaderSource call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9d3);
    (**(code **)(shader[1]._32_8_ + 0x248))(shader[(uint)log_size].count);
    dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
    glu::checkError(dVar3,"glCompileShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9d7);
    log_text._4_4_ = 0;
    (**(code **)(shader[1]._32_8_ + 0xa70))(shader[(uint)log_size].count,0x8b81,(long)&log_text + 4)
    ;
    dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9dc);
    if (log_text._4_4_ == 0) {
      log_text._0_4_ = 0;
      (**(code **)(shader[1]._32_8_ + 0xa70))(shader[(uint)log_size].count,0x8b84,&log_text);
      dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x9e2);
      local_a0 = (char *)operator_new__((long)(int)log_text);
      (**(code **)(shader[1]._32_8_ + 0xa58))(shader[(uint)log_size].count,(int)log_text,0,local_a0)
      ;
      pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar7 = tcu::TestContext::getLog(pTVar6);
      tcu::TestLog::operator<<(&local_220,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_220,(char (*) [32])"Shader compilation has failed.\n");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])"Shader type: ");
      EVar11 = glu::getShaderTypeStr(*(int *)((long)shader[(uint)log_size].source + 0x14));
      local_240 = EVar11.m_getName;
      local_238 = EVar11.m_value;
      local_230.m_getName = local_240;
      local_230.m_value = local_238;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_230);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(char (*) [31])"Shader compilation error log:\n");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_a0);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])"Shader source code:\n");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(char **)&shader[(ulong)(uint)log_size - 1].id);
      if (shader[(uint)log_size].source[0] == (GLchar *)0x0) {
        local_490 = "";
      }
      else {
        local_490 = shader[(uint)log_size].source[0];
      }
      local_248 = local_490;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_248);
      if (shader[(uint)log_size].source[1] == (GLchar *)0x0) {
        local_4a0 = "";
      }
      else {
        local_4a0 = shader[(uint)log_size].source[1];
      }
      _i_1 = local_4a0;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char **)&i_1);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_220);
      if (local_a0 != (char *)0x0) {
        operator_delete__(local_a0);
      }
      dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
      glu::checkError(dVar3,"glGetShaderInfoLog call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x9f4);
      puVar9 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar9 = 0;
      __cxa_throw(puVar9,&int::typeinfo,0);
    }
  }
  (**(code **)(shader[1]._32_8_ + 0xce8))(this->m_po);
  dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
  glu::checkError(dVar3,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x9fe);
  log_size_1 = 0;
  (**(code **)(shader[1]._32_8_ + 0x9d8))(this->m_po,0x8b82,&log_size_1);
  if (log_size_1 != 1) {
    log_text_1._4_4_ = 0;
    (**(code **)(shader[1]._32_8_ + 0x9d8))(this->m_po,0x8b84,(long)&log_text_1 + 4);
    dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xa16);
    local_268 = (char *)operator_new__((long)log_text_1._4_4_);
    (**(code **)(shader[1]._32_8_ + 0x988))(this->m_po,log_text_1._4_4_,0,local_268);
    pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_3e8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_3e8,
                        (char (*) [36])"Program linkage has failed due to:\n");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_268);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3e8);
    if (local_268 != (char *)0x0) {
      operator_delete__(local_268);
    }
    dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
    glu::checkError(dVar3,"glGetProgramInfoLog call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xa22);
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  for (local_258 = 0; local_258 < 2; local_258 = local_258 + 1) {
    if (shader[local_258].count != 0) {
      (**(code **)(shader[1]._32_8_ + 0x4e0))(this->m_po,shader[local_258].count);
      dVar3 = (**(code **)(shader[1]._32_8_ + 0x800))();
      glu::checkError(dVar3,"glDetachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0xa0c);
    }
  }
  for (local_3ec = 0; local_3ec < 2; local_3ec = local_3ec + 1) {
    if (shader[local_3ec].count != 0) {
      (**(code **)(shader[1]._32_8_ + 0x470))(shader[local_3ec].count);
      shader[local_3ec].count = 0;
    }
  }
  if (this->m_po == 0) {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  return;
}

Assistant:

void StorageAndSubImageTest::PrepareProgram(const glw::GLchar* variable_declaration, const glw::GLchar* tail)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* source[3];
		glw::GLsizei const count;
		glw::GLenum const  type;
		glw::GLuint		   id;
	} shader[] = { { { s_vertex_shader, NULL, NULL }, 1, GL_VERTEX_SHADER, 0 },
				   { { s_fragment_shader_head, variable_declaration, tail }, 3, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, shader[i].count, shader[i].source, NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source[0] << (shader[i].source[1] ? shader[i].source[1] : "")
						<< (shader[i].source[2] ? shader[i].source[2] : "") << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(m_po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(m_po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (m_po)
		{
			gl.deleteProgram(m_po);

			m_po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == m_po)
	{
		throw 0;
	}
}